

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

double __thiscall smf::Options::getDouble(Options *this,string *optionName)

{
  double dVar1;
  string local_28;
  
  getString(&local_28,this,optionName);
  dVar1 = strtod(local_28._M_dataplus._M_p,(char **)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  return dVar1;
}

Assistant:

double Options::getDouble(const std::string& optionName) {
   return strtod(getString(optionName).c_str(), (char**)NULL);
}